

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

void __thiscall
VW::config::typed_option<unsigned_int>::typed_option
          (typed_option<unsigned_int> *this,typed_option<unsigned_int> *param_2)

{
  shared_ptr<unsigned_int> *in_RSI;
  shared_ptr<unsigned_int> *in_RDI;
  
  config::base_option::base_option(&this->super_base_option,&param_2->super_base_option);
  (in_RDI->super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__typed_option_0048cd30;
  in_RDI[7].super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RSI[7].super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  std::shared_ptr<unsigned_int>::shared_ptr(in_RSI,in_RDI);
  std::shared_ptr<unsigned_int>::shared_ptr(in_RSI,in_RDI);
  return;
}

Assistant:

typed_option(const std::string& name, T& location) : base_option(name, typeid(T).hash_code()), m_location{location} {}